

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall flatbuffers::RPCCall::Deserialize(RPCCall *this,Parser *parser,RPCCall *call)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  const_iterator cVar6;
  StructDef *pSVar7;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  _Rb_tree_header *p_Var8;
  key_type local_50;
  
  uVar5 = (ulong)*(ushort *)(call + (4 - (long)*(int *)call));
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,call + (ulong)*(uint *)(call + uVar5) + 4 + uVar5,
             call + (ulong)*(uint *)(call + (ulong)*(uint *)(call + uVar5) + 4 + uVar5 + -4) +
                    *(uint *)(call + uVar5) + uVar5 + 4);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((*(ushort *)(call + -(long)*(int *)call) < 0xb) ||
     (uVar5 = (ulong)*(ushort *)(call + (10 - (long)*(int *)call)), uVar5 == 0)) {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
  }
  else {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
            (call + *(uint *)(call + uVar5) + uVar5);
  }
  bVar4 = DeserializeAttributesCommon(&(this->super_Definition).attributes,parser,attrs);
  if (bVar4) {
    if ((*(ushort *)(call + -(long)*(int *)call) < 0xd) ||
       (uVar5 = (ulong)*(ushort *)(call + (0xc - (long)*(int *)call)), uVar5 == 0)) {
      documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
    }
    else {
      documentation =
           (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
           (call + *(uint *)(call + uVar5) + uVar5);
    }
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    uVar5 = (ulong)*(ushort *)(call + (6 - (long)*(int *)call));
    lVar2 = *(uint *)(call + uVar5) + uVar5;
    lVar3 = (ulong)*(ushort *)
                    (call + (lVar2 - *(int *)(call + *(uint *)(call + uVar5) + uVar5)) + 4) + lVar2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               call + (ulong)*(uint *)(call + (ulong)*(ushort *)
                                                      (call + (lVar2 - *(int *)(call + *(uint *)(
                                                  call + uVar5) + uVar5)) + 4) + lVar2) + 4 + lVar3,
               call + (ulong)*(uint *)(call + (ulong)*(uint *)(call + (ulong)*(ushort *)
                                                                              (call + (lVar2 - *(int
                                                                                                 *)(
                                                  call + *(uint *)(call + uVar5) + uVar5)) + 4) +
                                                  lVar2) + 4 + lVar3 + -4) +
                      (ulong)*(uint *)(call + (ulong)*(ushort *)
                                                      (call + (lVar2 - *(int *)(call + *(uint *)(
                                                  call + uVar5) + uVar5)) + 4) + lVar2) + lVar3 + 4)
    ;
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                    *)&parser->structs_,&local_50);
    p_Var8 = &(parser->structs_).dict._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar6._M_node == p_Var8) {
      pSVar7 = (StructDef *)0x0;
    }
    else {
      pSVar7 = *(StructDef **)(cVar6._M_node + 2);
    }
    this->request = pSVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar5 = (ulong)*(ushort *)(call + (8 - (long)*(int *)call));
    lVar2 = *(uint *)(call + uVar5) + uVar5;
    lVar3 = (ulong)*(ushort *)
                    (call + (lVar2 - *(int *)(call + *(uint *)(call + uVar5) + uVar5)) + 4) + lVar2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               call + (ulong)*(uint *)(call + (ulong)*(ushort *)
                                                      (call + (lVar2 - *(int *)(call + *(uint *)(
                                                  call + uVar5) + uVar5)) + 4) + lVar2) + 4 + lVar3,
               call + (ulong)*(uint *)(call + (ulong)*(uint *)(call + (ulong)*(ushort *)
                                                                              (call + (lVar2 - *(int
                                                                                                 *)(
                                                  call + *(uint *)(call + uVar5) + uVar5)) + 4) +
                                                  lVar2) + 4 + lVar3 + -4) +
                      (ulong)*(uint *)(call + (ulong)*(ushort *)
                                                      (call + (lVar2 - *(int *)(call + *(uint *)(
                                                  call + uVar5) + uVar5)) + 4) + lVar2) + lVar3 + 4)
    ;
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                    *)&parser->structs_,&local_50);
    if ((_Rb_tree_header *)cVar6._M_node == p_Var8) {
      pSVar7 = (StructDef *)0x0;
    }
    else {
      pSVar7 = *(StructDef **)(cVar6._M_node + 2);
    }
    this->response = pSVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      pSVar7 = this->response;
    }
    bVar4 = pSVar7 != (StructDef *)0x0 && this->request != (StructDef *)0x0;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool RPCCall::Deserialize(Parser &parser, const reflection::RPCCall *call) {
  name = call->name()->str();
  if (!DeserializeAttributes(parser, call->attributes())) return false;
  DeserializeDoc(doc_comment, call->documentation());
  request = parser.structs_.Lookup(call->request()->name()->str());
  response = parser.structs_.Lookup(call->response()->name()->str());
  if (!request || !response) { return false; }
  return true;
}